

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavProcessItem(ImGuiWindow *window,ImRect *nav_bb,ImGuiID id)

{
  ImVec2 IVar1;
  ImRect cand;
  ImRect cand_00;
  long lVar2;
  bool bVar3;
  undefined8 *puVar4;
  int in_EDX;
  ImRect *in_RSI;
  long in_RDI;
  float fVar5;
  float fVar6;
  float VISIBLE_RATIO;
  bool new_best;
  ImGuiNavMoveResult *result;
  ImRect nav_bb_rel;
  ImGuiItemFlags item_flags;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int *local_90;
  ImVec2 local_44;
  float local_3c;
  float fVar7;
  float in_stack_ffffffffffffffcc;
  float fStack_30;
  ImVec2 in_stack_ffffffffffffffd4;
  uint uVar8;
  float fVar9;
  undefined4 uStack_1c;
  
  fVar9 = SUB84(GImGui,0);
  uStack_1c = (undefined4)((ulong)GImGui >> 0x20);
  uVar8 = *(uint *)(in_RDI + 0x178);
  IVar1 = operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                    (ImVec2 *)0x13cf95);
  local_3c = IVar1.x;
  fVar7 = IVar1.y;
  local_44 = operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                       (ImVec2 *)0x13cfb8);
  ImRect::ImRect((ImRect *)&stack0xffffffffffffffcc,(ImVec2 *)&local_3c,&local_44);
  if (((*(byte *)(CONCAT44(uStack_1c,fVar9) + 0x1bb1) & 1) != 0) &&
     (*(int *)(CONCAT44(uStack_1c,fVar9) + 0x1ba4) == *(int *)(in_RDI + 0x13c))) {
    if (((uVar8 & 0x10) == 0) || (*(int *)(CONCAT44(uStack_1c,fVar9) + 0x1bb4) == 0)) {
      *(int *)(CONCAT44(uStack_1c,fVar9) + 0x1bb4) = in_EDX;
      *(ulong *)(CONCAT44(uStack_1c,fVar9) + 0x1bb8) = CONCAT44(fStack_30,in_stack_ffffffffffffffcc)
      ;
      *(ImVec2 *)(CONCAT44(uStack_1c,fVar9) + 0x1bc0) = in_stack_ffffffffffffffd4;
    }
    if ((uVar8 & 0x10) == 0) {
      *(undefined1 *)(CONCAT44(uStack_1c,fVar9) + 0x1bb1) = 0;
      NavUpdateAnyRequestFlag();
    }
  }
  if (((*(int *)(CONCAT44(uStack_1c,fVar9) + 0x1b48) != in_EDX) ||
      ((*(uint *)(CONCAT44(uStack_1c,fVar9) + 0x1bcc) & 0x10) != 0)) && ((uVar8 & 8) == 0)) {
    if (in_RDI == *(long *)(CONCAT44(uStack_1c,fVar9) + 0x1b40)) {
      local_90 = (int *)(CONCAT44(uStack_1c,fVar9) + 0x1be0);
    }
    else {
      local_90 = (int *)(CONCAT44(uStack_1c,fVar9) + 0x1c40);
    }
    bVar3 = false;
    if ((*(byte *)(CONCAT44(uStack_1c,fVar9) + 0x1bc9) & 1) != 0) {
      cand.Max.x = (float)uVar8;
      cand.Min = in_stack_ffffffffffffffd4;
      cand.Max.y = fVar9;
      bVar3 = NavScoreItem((ImGuiNavMoveResult *)CONCAT44(in_stack_ffffffffffffffcc,fVar7),cand);
    }
    if (bVar3 != false) {
      *local_90 = in_EDX;
      *(long *)(local_90 + 2) = in_RDI;
      *(ulong *)(local_90 + 7) = CONCAT44(fStack_30,in_stack_ffffffffffffffcc);
      *(ImVec2 *)(local_90 + 9) = in_stack_ffffffffffffffd4;
    }
    if (((*(uint *)(CONCAT44(uStack_1c,fVar9) + 0x1bcc) & 0x20) != 0) &&
       (bVar3 = ImRect::Overlaps((ImRect *)(in_RDI + 0x1f8),in_RSI), bVar3)) {
      fVar5 = ImClamp<float>((in_RSI->Max).y,*(float *)(in_RDI + 0x1fc),*(float *)(in_RDI + 0x204));
      fVar6 = ImClamp<float>((in_RSI->Min).y,*(float *)(in_RDI + 0x1fc),*(float *)(in_RDI + 0x204));
      if ((((in_RSI->Max).y - (in_RSI->Min).y) * 0.7 <= fVar5 - fVar6) &&
         (cand_00.Max.x = (float)uVar8, cand_00.Min = in_stack_ffffffffffffffd4,
         cand_00.Max.y = fVar9,
         bVar3 = NavScoreItem((ImGuiNavMoveResult *)CONCAT44(in_stack_ffffffffffffffcc,fVar7),
                              cand_00), bVar3)) {
        lVar2 = CONCAT44(uStack_1c,fVar9);
        *(int *)(lVar2 + 0x1c10) = in_EDX;
        *(long *)(lVar2 + 0x1c18) = in_RDI;
        *(ulong *)(lVar2 + 0x1c2c) = CONCAT44(fStack_30,in_stack_ffffffffffffffcc);
        *(ImVec2 *)(lVar2 + 0x1c34) = in_stack_ffffffffffffffd4;
      }
    }
  }
  if (*(int *)(CONCAT44(uStack_1c,fVar9) + 0x1b48) == in_EDX) {
    *(long *)(CONCAT44(uStack_1c,fVar9) + 0x1b40) = in_RDI;
    *(undefined4 *)(CONCAT44(uStack_1c,fVar9) + 0x1ba4) = *(undefined4 *)(in_RDI + 0x13c);
    *(undefined1 *)(CONCAT44(uStack_1c,fVar9) + 0x1bac) = 1;
    *(undefined4 *)(CONCAT44(uStack_1c,fVar9) + 0x1ba8) = *(undefined4 *)(in_RDI + 0x3ac);
    puVar4 = (undefined8 *)(in_RDI + 0x388 + (ulong)*(uint *)(in_RDI + 0x13c) * 0x10);
    *puVar4 = CONCAT44(fStack_30,in_stack_ffffffffffffffcc);
    *(ImVec2 *)(puVar4 + 1) = in_stack_ffffffffffffffd4;
  }
  return;
}

Assistant:

static void ImGui::NavProcessItem(ImGuiWindow* window, const ImRect& nav_bb, const ImGuiID id)
{
    ImGuiContext& g = *GImGui;
    //if (!g.IO.NavActive)  // [2017/10/06] Removed this possibly redundant test but I am not sure of all the side-effects yet. Some of the feature here will need to work regardless of using a _NoNavInputs flag.
    //    return;

    const ImGuiItemFlags item_flags = window->DC.ItemFlags;
    const ImRect nav_bb_rel(nav_bb.Min - window->Pos, nav_bb.Max - window->Pos);

    // Process Init Request
    if (g.NavInitRequest && g.NavLayer == window->DC.NavLayerCurrent)
    {
        // Even if 'ImGuiItemFlags_NoNavDefaultFocus' is on (typically collapse/close button) we record the first ResultId so they can be used as a fallback
        if (!(item_flags & ImGuiItemFlags_NoNavDefaultFocus) || g.NavInitResultId == 0)
        {
            g.NavInitResultId = id;
            g.NavInitResultRectRel = nav_bb_rel;
        }
        if (!(item_flags & ImGuiItemFlags_NoNavDefaultFocus))
        {
            g.NavInitRequest = false; // Found a match, clear request
            NavUpdateAnyRequestFlag();
        }
    }

    // Process Move Request (scoring for navigation)
    // FIXME-NAV: Consider policy for double scoring (scoring from NavScoringRectScreen + scoring from a rect wrapped according to current wrapping policy)
    if ((g.NavId != id || (g.NavMoveRequestFlags & ImGuiNavMoveFlags_AllowCurrentNavId)) && !(item_flags & ImGuiItemFlags_NoNav))
    {
        ImGuiNavMoveResult* result = (window == g.NavWindow) ? &g.NavMoveResultLocal : &g.NavMoveResultOther;
#if IMGUI_DEBUG_NAV_SCORING
        // [DEBUG] Score all items in NavWindow at all times
        if (!g.NavMoveRequest)
            g.NavMoveDir = g.NavMoveDirLast;
        bool new_best = NavScoreItem(result, nav_bb) && g.NavMoveRequest;
#else
        bool new_best = g.NavMoveRequest && NavScoreItem(result, nav_bb);
#endif
        if (new_best)
        {
            result->ID = id;
            result->Window = window;
            result->RectRel = nav_bb_rel;
        }

        const float VISIBLE_RATIO = 0.70f;
        if ((g.NavMoveRequestFlags & ImGuiNavMoveFlags_AlsoScoreVisibleSet) && window->ClipRect.Overlaps(nav_bb))
            if (ImClamp(nav_bb.Max.y, window->ClipRect.Min.y, window->ClipRect.Max.y) - ImClamp(nav_bb.Min.y, window->ClipRect.Min.y, window->ClipRect.Max.y) >= (nav_bb.Max.y - nav_bb.Min.y) * VISIBLE_RATIO)
                if (NavScoreItem(&g.NavMoveResultLocalVisibleSet, nav_bb))
                {
                    result = &g.NavMoveResultLocalVisibleSet;
                    result->ID = id;
                    result->Window = window;
                    result->RectRel = nav_bb_rel;
                }
    }

    // Update window-relative bounding box of navigated item
    if (g.NavId == id)
    {
        g.NavWindow = window;                                           // Always refresh g.NavWindow, because some operations such as FocusItem() don't have a window.
        g.NavLayer = window->DC.NavLayerCurrent;
        g.NavIdIsAlive = true;
        g.NavIdTabCounter = window->FocusIdxTabCounter;
        window->NavRectRel[window->DC.NavLayerCurrent] = nav_bb_rel;    // Store item bounding box (relative to window position)
    }
}